

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StackMemory.hpp
# Opt level: O0

void __thiscall Lodtalk::StackPage::freed(StackPage *this)

{
  StackFrame local_20;
  StackPage *local_10;
  StackPage *this_local;
  
  this->baseFramePointer = (uint8_t *)0x0;
  local_10 = this;
  StackFrame::StackFrame(&local_20,(uint8_t *)0x0,(uint8_t *)0x0);
  (this->headFrame).framePointer = local_20.framePointer;
  (this->headFrame).stackPointer = local_20.stackPointer;
  StackFrame::~StackFrame(&local_20);
  if (this->previousPage != (StackPage *)0x0) {
    this->previousPage->nextPage = this->nextPage;
  }
  if (this->nextPage != (StackPage *)0x0) {
    this->nextPage->previousPage = this->previousPage;
  }
  this->previousPage = (StackPage *)0x0;
  this->nextPage = (StackPage *)0x0;
  return;
}

Assistant:

inline void freed()
    {
        baseFramePointer = nullptr;
        headFrame = StackFrame(nullptr, nullptr);

        // Remove myself from the linked list.
        if (previousPage)
            previousPage->nextPage = nextPage;
        if (nextPage)
            nextPage->previousPage = previousPage;
        previousPage = nullptr;
        nextPage = nullptr;
    }